

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

void __thiscall Fl_Help_View::topline(Fl_Help_View *this,int top)

{
  int total;
  int iVar1;
  int pos;
  
  if (this->value_ != (char *)0x0) {
    iVar1 = this->scrollbar_size_;
    if (iVar1 == 0) {
      iVar1 = Fl::scrollbar_size();
    }
    total = this->size_;
    iVar1 = (this->super_Fl_Group).super_Fl_Widget.h_ - iVar1;
    pos = top;
    if (total < top) {
      pos = total;
    }
    if (total < iVar1) {
      pos = 0;
    }
    if (top < 0) {
      pos = 0;
    }
    this->topline_ = pos;
    Fl_Slider::scrollvalue(&(this->scrollbar_).super_Fl_Slider,pos,iVar1,0,total);
    Fl_Widget::do_callback
              ((Fl_Widget *)this,(Fl_Widget *)this,(this->super_Fl_Group).super_Fl_Widget.user_data_
              );
    Fl_Widget::redraw((Fl_Widget *)this);
    return;
  }
  return;
}

Assistant:

void
Fl_Help_View::topline(int top)	// I - Top line number
{
  if (!value_)
    return;

  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  if (size_ < (h() - scrollsize) || top < 0)
    top = 0;
  else if (top > size_)
    top = size_;

  topline_ = top;

  scrollbar_.value(topline_, h() - scrollsize, 0, size_);

  do_callback();

  redraw();
}